

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Relooper.cpp
# Opt level: O2

void __thiscall
CFG::Block::AddSwitchBranchTo
          (Block *this,Block *Target,vector<unsigned_int,_std::allocator<unsigned_int>_> *Values,
          Expression *Code)

{
  bool bVar1;
  Branch *pBVar2;
  Branch **ppBVar3;
  Block *local_30;
  Block *Target_local;
  
  local_30 = Target;
  bVar1 = contains<wasm::InsertOrderedMap<CFG::Block*,CFG::Branch*>,CFG::Block*>
                    (&this->BranchesOut,&local_30);
  if (!bVar1) {
    pBVar2 = Relooper::AddBranch(this->relooper,Values,Code);
    ppBVar3 = ::wasm::InsertOrderedMap<CFG::Block_*,_CFG::Branch_*>::operator[]
                        (&this->BranchesOut,&local_30);
    *ppBVar3 = pBVar2;
    return;
  }
  __assert_fail("!contains(BranchesOut, Target)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/cfg/Relooper.cpp"
                ,0x9f,
                "void CFG::Block::AddSwitchBranchTo(Block *, std::vector<wasm::Index> &&, wasm::Expression *)"
               );
}

Assistant:

void Block::AddSwitchBranchTo(Block* Target,
                              std::vector<wasm::Index>&& Values,
                              wasm::Expression* Code) {
  // cannot add more than one branch to the same target
  assert(!contains(BranchesOut, Target));
  BranchesOut[Target] = relooper->AddBranch(std::move(Values), Code);
}